

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<char,_example> *
LEARNER::init_learner<char,example,LEARNER::learner<char,char>>
          (_func_void_char_ptr_learner<char,_char>_ptr_example_ptr *predict,size_t params_per_weight
          )

{
  learner<char,_example> *plVar1;
  
  plVar1 = learner<char,example>::init_learner<LEARNER::learner<char,char>>
                     ((char *)0x0,(learner<char,_char> *)0x0,predict,predict,params_per_weight,
                      scalar);
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  return learner<T, E>::init_learner(
      nullptr, (L*)nullptr, predict, predict, params_per_weight, prediction_type::scalar);
}